

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int h2_process_pending_input(Curl_cfilter *cf,Curl_easy *data,CURLcode *err)

{
  CURLcode *pCVar1;
  Curl_easy *cf_00;
  _Bool _Var2;
  int iVar3;
  size_t sVar4;
  char *pcVar5;
  ssize_t rv;
  size_t blen;
  uchar *buf;
  cf_h2_ctx *ctx;
  CURLcode *err_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  buf = (uchar *)cf->ctx;
  ctx = (cf_h2_ctx *)err;
  err_local = &data->magic;
  data_local = (Curl_easy *)cf;
  while (_Var2 = Curl_bufq_peek((bufq *)(buf + 0x18),(uchar **)&blen,(size_t *)&rv), _Var2) {
    sVar4 = nghttp2_session_mem_recv(*(nghttp2_session **)buf,(uint8_t *)blen,rv);
    pCVar1 = err_local;
    if ((long)sVar4 < 0) {
      pcVar5 = nghttp2_strerror((int)sVar4);
      Curl_failf((Curl_easy *)pCVar1,
                 "process_pending_input: nghttp2_session_mem_recv() returned %zd:%s",sVar4,pcVar5);
      *(undefined4 *)&ctx->h2 = 0x38;
      return -1;
    }
    Curl_bufq_skip((bufq *)(buf + 0x18),sVar4);
    _Var2 = Curl_bufq_is_empty((bufq *)(buf + 0x18));
    cf_00 = data_local;
    pCVar1 = err_local;
    if (_Var2) break;
    if ((((err_local != (CURLcode *)0x0) && ((*(ulong *)((long)err_local + 0xa52) >> 0x1c & 1) != 0)
         ) && (data_local != (Curl_easy *)0x0)) && (0 < *(int *)(*(long *)data_local + 0xc))) {
      sVar4 = Curl_bufq_len((bufq *)(buf + 0x18));
      Curl_trc_cf_infof((Curl_easy *)pCVar1,(Curl_cfilter *)cf_00,
                        "process_pending_input: %zu bytes left in connection buffer",sVar4);
    }
  }
  iVar3 = nghttp2_session_check_request_allowed(*(nghttp2_session **)buf);
  if (iVar3 == 0) {
    Curl_conncontrol((connectdata *)data_local->prev,1);
  }
  return 0;
}

Assistant:

static int h2_process_pending_input(struct Curl_cfilter *cf,
                                    struct Curl_easy *data,
                                    CURLcode *err)
{
  struct cf_h2_ctx *ctx = cf->ctx;
  const unsigned char *buf;
  size_t blen;
  ssize_t rv;

  while(Curl_bufq_peek(&ctx->inbufq, &buf, &blen)) {

    rv = nghttp2_session_mem_recv(ctx->h2, (const uint8_t *)buf, blen);
    if(rv < 0) {
      failf(data,
            "process_pending_input: nghttp2_session_mem_recv() returned "
            "%zd:%s", rv, nghttp2_strerror((int)rv));
      *err = CURLE_RECV_ERROR;
      return -1;
    }
    Curl_bufq_skip(&ctx->inbufq, (size_t)rv);
    if(Curl_bufq_is_empty(&ctx->inbufq)) {
      break;
    }
    else {
      CURL_TRC_CF(data, cf, "process_pending_input: %zu bytes left "
                  "in connection buffer", Curl_bufq_len(&ctx->inbufq));
    }
  }

  if(nghttp2_session_check_request_allowed(ctx->h2) == 0) {
    /* No more requests are allowed in the current session, so
       the connection may not be reused. This is set when a
       GOAWAY frame has been received or when the limit of stream
       identifiers has been reached. */
    connclose(cf->conn, "http/2: No new requests allowed");
  }

  return 0;
}